

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.hpp
# Opt level: O0

void __thiscall
Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::Atari16k>::Cartridge
          (Cartridge<Atari2600::Cartridge::Atari16k> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *rom)

{
  uchar *rom_base;
  size_type rom_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rom_local;
  Cartridge<Atari2600::Cartridge::Atari16k> *this_local;
  
  Bus::Bus(&this->super_Bus);
  (this->super_Bus)._vptr_Bus = (_func_int **)&PTR__Cartridge_00c9d4a8;
  CPU::MOS6502::
  Processor<(CPU::MOS6502::Personality)1,_Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::Atari16k>,_true>
  ::Processor(&this->m6502_,this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom_,rom);
  rom_base = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom_);
  rom_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(rom);
  Atari16k::Atari16k(&this->bus_extender_,rom_base,rom_size);
  this->horizontal_counter_resets_ = 0;
  Cycles::Cycles(&this->cycle_count_);
  return;
}

Assistant:

Cartridge(const std::vector<uint8_t> &rom) :
			m6502_(*this),
			rom_(rom),
			bus_extender_(rom_.data(), rom.size()) {
			// The above works because bus_extender_ is declared after rom_ in the instance storage list;
			// consider doing something less fragile.
		}